

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O1

_Bool gravity_hash_insert(gravity_hash_t *hashtable,gravity_value_t key,gravity_value_t value)

{
  hash_node_s *phVar1;
  gravity_hash_iterate_fn p_Var2;
  gravity_value_t gVar3;
  gravity_value_t gVar4;
  gravity_value_t gVar5;
  _Bool _Var6;
  uint32_t uVar7;
  hash_node_t **pphVar8;
  hash_node_t *phVar9;
  gravity_class_t *pgVar10;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar11;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar12;
  ulong uVar13;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint32_t uVar14;
  gravity_class_t *in_stack_ffffffffffffff78;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 in_stack_ffffffffffffff80;
  gravity_hash_t local_68;
  
  pgVar10 = value.isa;
  aVar11 = key.field_1;
  aVar12.n = (gravity_int_t)key.isa;
  if (hashtable->count < 0x40000000) {
    gVar3.isa._4_4_ = in_stack_ffffffffffffff6c;
    gVar3.isa._0_4_ = in_stack_ffffffffffffff68;
    gVar3.field_1.n = aVar12.n;
    uVar7 = (*hashtable->compute_fn)(gVar3);
    uVar13 = (ulong)uVar7 % (ulong)hashtable->size;
    phVar9 = hashtable->nodes[uVar13];
    uVar14 = uVar7;
    if (phVar9 != (hash_node_t *)0x0) {
      hashtable->ncollision = hashtable->ncollision + 1;
      do {
        if ((phVar9->hash == uVar7) &&
           (gVar4.isa._4_4_ = uVar14, gVar4.isa._0_4_ = in_stack_ffffffffffffff68,
           gVar4.field_1.n = aVar12.n, gVar5.field_1.n = in_stack_ffffffffffffff80.n,
           gVar5.isa = in_stack_ffffffffffffff78, uVar7 = uVar14,
           _Var6 = (*hashtable->isequal_fn)(gVar4,gVar5), uVar14 = uVar7, _Var6)) {
          (phVar9->value).isa = pgVar10;
          (phVar9->value).field_1.n = (gravity_int_t)value.field_1;
          return false;
        }
        phVar9 = phVar9->next;
      } while (phVar9 != (hash_node_s *)0x0);
    }
    if ((double)hashtable->count < (double)hashtable->size * 0.75) {
LAB_0012a217:
      phVar9 = (hash_node_t *)gravity_calloc((gravity_vm *)0x0,1,0x30);
      if (phVar9 != (hash_node_t *)0x0) {
        (phVar9->key).isa = (gravity_class_t *)aVar12;
        (phVar9->key).field_1.n = (gravity_int_t)aVar11;
        phVar9->hash = uVar14;
        (phVar9->value).isa = pgVar10;
        (phVar9->value).field_1.n = (gravity_int_t)value.field_1;
        pphVar8 = hashtable->nodes;
        phVar9->next = pphVar8[uVar13];
        pphVar8[uVar13] = phVar9;
        hashtable->count = hashtable->count + 1;
        return true;
      }
      return false;
    }
    local_68.size = hashtable->size * 2;
    local_68.count = 0;
    local_68.nodes = (hash_node_t **)0x0;
    local_68.compute_fn = hashtable->compute_fn;
    local_68.isequal_fn = hashtable->isequal_fn;
    local_68.free_fn = (gravity_hash_iterate_fn)0x0;
    local_68.data = (void *)0x0;
    local_68.ncollision = 0;
    local_68.nresize = 0;
    pphVar8 = (hash_node_t **)gravity_calloc((gravity_vm *)0x0,(ulong)local_68.size,8);
    if (pphVar8 != (hash_node_t **)0x0) {
      local_68.nodes = pphVar8;
      if (hashtable->size != 0) {
        uVar13 = 0;
        do {
          phVar9 = hashtable->nodes[uVar13];
          while (phVar9 != (hash_node_t *)0x0) {
            phVar1 = phVar9->next;
            gravity_hash_insert(&local_68,phVar9->key,phVar9->value);
            p_Var2 = hashtable->free_fn;
            hashtable->free_fn = (gravity_hash_iterate_fn)0x0;
            gravity_hash_remove(hashtable,phVar9->key);
            hashtable->free_fn = p_Var2;
            phVar9 = phVar1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < hashtable->size);
      }
      free(hashtable->nodes);
      hashtable->size = local_68.size;
      hashtable->count = local_68.count;
      hashtable->nresize = hashtable->nresize + 1;
      hashtable->nodes = local_68.nodes;
      if (pphVar8 != (hash_node_t **)0x0) {
        uVar13 = (ulong)uVar14 % (ulong)hashtable->size;
        goto LAB_0012a217;
      }
    }
  }
  return false;
}

Assistant:

bool gravity_hash_insert (gravity_hash_t *hashtable, gravity_value_t key, gravity_value_t value) {
    if (hashtable->count >= GRAVITYHASH_MAXENTRIES) return false;
    
    register uint32_t hash = hashtable->compute_fn(key);
    register uint32_t position = hash % hashtable->size;

    hash_node_t *node = hashtable->nodes[position];
    if (node) INC_COLLISION(hashtable);

    // check if the key is already in the table
    while (node) {
        if ((node->hash == hash) && (hashtable->isequal_fn(key, node->key))) {
            node->value = value;
            return false;
        }
        node = node->next;
    }

    // resize table if the threshold is exceeded
    // default threshold is: <table size> * <load factor GRAVITYHASH_THRESHOLD>
    if (hashtable->count >= hashtable->size * GRAVITYHASH_THRESHOLD) {
        if (gravity_hash_resize(hashtable) == -1) return false;
        // recompute position here because hashtable->size has changed!
        position = hash % hashtable->size;
    }

    // allocate new entry and set new data
    if (!(node = mem_alloc(NULL, sizeof(hash_node_t)))) return false;
    node->key = key;
    node->hash = hash;
    node->value = value;
    node->next = hashtable->nodes[position];
    hashtable->nodes[position] = node;
    ++hashtable->count;

    return true;
}